

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

eval_error * __thiscall
chaiscript::boxed_cast<chaiscript::exception::eval_error_const*>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  eval_error *peVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  undefined8 *puVar6;
  Type_Conversions_State *extraout_RDX;
  Type_Conversions_State *extraout_RDX_00;
  Boxed_Value BVar7;
  undefined1 local_78 [8];
  undefined1 auStack_70 [32];
  pointer_____offset_0x10___ *local_50;
  undefined4 local_48;
  
  if (bv != (Boxed_Value *)0x0) {
    local_78 = (undefined1  [8])&exception::eval_error_const*::typeinfo;
    auStack_70._0_8_ = &exception::eval_error::typeinfo;
    auStack_70._8_4_ = 5;
    bVar5 = Type_Info::bare_equal(*(Type_Info **)this,(Type_Info *)local_78);
    t_conversions = extraout_RDX;
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<chaiscript::exception::eval_error_const*>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), t_conversions = extraout_RDX_00, bVar5)) {
      if ((bv != (Boxed_Value *)0x0) &&
         (bVar5 = Type_Conversions::convertable_type<chaiscript::exception::eval_error_const*>
                            ((Type_Conversions *)
                             (bv->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), bVar5)) {
        auStack_70._24_8_ = &exception::eval_error_const*::typeinfo;
        local_50 = &exception::eval_error::typeinfo;
        local_48 = 5;
        BVar7 = Type_Conversions::boxed_type_conversion
                          ((Type_Conversions *)local_78,
                           &((bv->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_type_info,(Conversion_Saves *)(auStack_70 + 0x18),
                           (Boxed_Value *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        peVar1 = *(eval_error **)((long)local_78 + 0x28);
        detail::verify_type_no_throw<void>
                  ((Boxed_Value *)local_78,(type_info *)&exception::eval_error::typeinfo,
                   BVar7.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_70._0_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return peVar1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_70._0_8_);
        return peVar1;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      puVar2 = *(undefined8 **)this;
      auStack_70._8_8_ = puVar2[2];
      peVar3 = (element_type *)*puVar2;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
      *puVar6 = &PTR__bad_cast_003b4620;
      local_78._0_4_ = SUB84(peVar3,0);
      local_78._4_4_ = (undefined4)((ulong)peVar3 >> 0x20);
      auStack_70._0_4_ = SUB84(p_Var4,0);
      auStack_70._4_4_ = (undefined4)((ulong)p_Var4 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_78._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_78._4_4_;
      *(undefined4 *)(puVar6 + 2) = auStack_70._0_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = auStack_70._4_4_;
      puVar6[3] = auStack_70._8_8_;
      puVar6[4] = &exception::eval_error_const*::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_78 = (undefined1  [8])peVar3;
      auStack_70._0_8_ = p_Var4;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  peVar1 = *(eval_error **)(*(long *)this + 0x28);
  detail::verify_type_no_throw<void>
            ((Boxed_Value *)this,(type_info *)&exception::eval_error::typeinfo,t_conversions);
  return peVar1;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }